

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

RawBrandedSchema * __thiscall
capnp::SchemaLoader::Impl::makeBranded
          (Impl *this,RawSchema *schema,ArrayPtr<const_capnp::_::RawBrandedSchema::Scope> bindings)

{
  Array<kj::_::HashBucket> *pAVar1;
  size_t *psVar2;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  **ppRVar3;
  uint uVar4;
  Entry *pEVar5;
  size_t sVar6;
  ArrayDisposer *pAVar7;
  Entry *pEVar8;
  RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
  *pRVar9;
  Entry *pEVar10;
  uint uVar11;
  ulong uVar12;
  Entry *pEVar13;
  undefined8 uVar15;
  uint32_t uVar16;
  Scope *ptr;
  HashBucket *pHVar17;
  ulong capacity;
  uint uVar18;
  size_t sVar19;
  size_t in_R8;
  HashBucket *pHVar20;
  long lVar21;
  long lVar22;
  size_t __n;
  ArrayPtr<const_unsigned_char> s;
  ArrayPtr<const_kj::_::HashBucket> oldBuckets;
  SchemaBindingsPair key;
  Array<kj::_::HashBucket> local_78;
  undefined8 *local_60;
  size_t local_58;
  HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*> *local_50;
  HashBucket local_48;
  RawSchema *local_40;
  Scope *local_38;
  HashBucket HVar14;
  
  ptr = bindings.ptr;
  if (bindings.size_ == 0) {
    HVar14 = (HashBucket)&schema->defaultBrand;
  }
  else {
    local_40 = schema;
    local_38 = ptr;
    kj::
    Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
    ::find<0ul,capnp::(anonymous_namespace)::SchemaBindingsPair&>
              ((Table<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Entry,kj::HashIndex<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,capnp::_::RawBrandedSchema*>::Callbacks>>
                *)&local_78,(SchemaBindingsPair *)&this->brands);
    if (local_78.ptr == (HashBucket *)0x0) {
      local_58 = bindings.size_;
      local_50 = &this->brands;
      local_48 = (HashBucket)kj::Arena::allocateBytes(&this->arena,0x28,8,false);
      *(undefined8 *)local_48 = 0;
      *(Scope **)((long)local_48 + 8) = (Scope *)0x0;
      *(Dependency **)((long)local_48 + 0x10) = (Dependency *)0x0;
      *(undefined8 *)((long)local_48 + 0x18) = 0;
      *(Initializer **)((long)local_48 + 0x20) = (Initializer *)0x0;
      pEVar5 = (this->brands).table.rows.builder.ptr;
      lVar21 = (long)(this->brands).table.rows.builder.pos - (long)pEVar5 >> 3;
      lVar22 = lVar21 * -0x5555555555555555;
      pHVar17 = (HashBucket *)(this->brands).table.indexes.buckets.size_;
      if ((ulong)((long)pHVar17 * 2) < ((this->brands).table.indexes.erasedCount + lVar22) * 3 + 3)
      {
        pAVar1 = &(this->brands).table.indexes.buckets;
        oldBuckets.size_ = lVar21 + 3;
        oldBuckets.ptr = pHVar17;
        kj::_::rehash(&local_78,(_ *)pAVar1->ptr,oldBuckets,in_R8);
        pHVar17 = pAVar1->ptr;
        if (pHVar17 != (HashBucket *)0x0) {
          sVar6 = (this->brands).table.indexes.buckets.size_;
          pAVar1->ptr = (HashBucket *)0x0;
          (this->brands).table.indexes.buckets.size_ = 0;
          pAVar7 = (this->brands).table.indexes.buckets.disposer;
          (*(code *)**(undefined8 **)pAVar7)(pAVar7,pHVar17,8,sVar6,sVar6,0);
        }
        (this->brands).table.indexes.buckets.ptr = local_78.ptr;
        (this->brands).table.indexes.buckets.size_ = local_78.size_;
        (this->brands).table.indexes.buckets.disposer = local_78.disposer;
        (this->brands).table.indexes.erasedCount = 0;
      }
      uVar11 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,schema);
      local_78.ptr = (HashBucket *)CONCAT44(local_78.ptr._4_4_,uVar11);
      uVar11 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,ptr);
      local_78.ptr = (HashBucket *)CONCAT44(uVar11,local_78.ptr._0_4_);
      s.size_ = 8;
      s.ptr = (uchar *)&local_78;
      uVar11 = kj::_::HashCoder::operator*((HashCoder *)&kj::_::HASHCODER,s);
      sVar6 = (this->brands).table.indexes.buckets.size_;
      uVar18 = (int)sVar6 - 1U & uVar11;
      pHVar17 = (HashBucket *)0x0;
      do {
        pHVar20 = (this->brands).table.indexes.buckets.ptr + uVar18;
        uVar4 = pHVar20->value;
        if (uVar4 == 1) {
          if (pHVar17 == (HashBucket *)0x0) {
            pHVar17 = pHVar20;
          }
        }
        else {
          if (uVar4 == 0) {
            if (pHVar17 != (HashBucket *)0x0) {
              psVar2 = &(this->brands).table.indexes.erasedCount;
              *psVar2 = *psVar2 - 1;
              pHVar20 = pHVar17;
            }
            *pHVar20 = (HashBucket)(((ulong)uVar11 | lVar22 << 0x20) + 0x200000000);
            pEVar5 = (this->brands).table.rows.builder.pos;
            pEVar8 = (this->brands).table.rows.builder.endPtr;
            uVar16 = (uint32_t)local_58;
            if (pEVar5 == pEVar8) {
              pEVar13 = (local_50->table).rows.builder.ptr;
              capacity = 4;
              if (pEVar8 != pEVar13) {
                capacity = ((long)pEVar8 - (long)pEVar13 >> 3) * 0x5555555555555556;
              }
              uVar12 = ((long)pEVar5 - (long)pEVar13 >> 3) * -0x5555555555555555;
              if (capacity <= uVar12 && uVar12 - capacity != 0) {
                (this->brands).table.rows.builder.pos = pEVar13 + capacity;
              }
              pEVar13 = (Entry *)kj::_::HeapArrayDisposer::allocateImpl
                                           (0x18,0,capacity,(_func_void_void_ptr *)0x0,
                                            (_func_void_void_ptr *)0x0);
              pEVar5 = pEVar13 + capacity;
              local_60 = &kj::_::HeapArrayDisposer::instance;
              pEVar8 = (this->brands).table.rows.builder.ptr;
              __n = (long)(this->brands).table.rows.builder.pos - (long)pEVar8;
              local_78.ptr = (HashBucket *)pEVar13;
              local_78.disposer = (ArrayDisposer *)pEVar5;
              if (__n != 0) {
                local_78.size_ = (size_t)pEVar13;
                memcpy(pEVar13,pEVar8,__n);
              }
              pEVar8 = (local_50->table).rows.builder.ptr;
              if (pEVar8 != (Entry *)0x0) {
                pRVar9 = (this->brands).table.rows.builder.pos;
                pEVar10 = (this->brands).table.rows.builder.endPtr;
                (local_50->table).rows.builder.ptr = (Entry *)0x0;
                (local_50->table).rows.builder.pos =
                     (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                      *)0x0;
                (local_50->table).rows.builder.endPtr = (Entry *)0x0;
                pAVar7 = (this->brands).table.rows.builder.disposer;
                local_78.size_ = (size_t)((long)pEVar13 + __n);
                (*(code *)**(undefined8 **)pAVar7)
                          (pAVar7,pEVar8,0x18,
                           ((long)pRVar9 - (long)pEVar8 >> 3) * -0x5555555555555555,
                           ((long)pEVar10 - (long)pEVar8 >> 3) * -0x5555555555555555,0);
              }
              (this->brands).table.rows.builder.ptr = pEVar13;
              (this->brands).table.rows.builder.pos =
                   (RemoveConst<kj::HashMap<capnp::(anonymous_namespace)::SchemaBindingsPair,_capnp::_::RawBrandedSchema_*>::Entry>
                    *)((long)pEVar13 + __n);
              (this->brands).table.rows.builder.endPtr = pEVar5;
              (this->brands).table.rows.builder.disposer =
                   (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
              uVar16 = (uint32_t)local_58;
            }
            pRVar9 = (this->brands).table.rows.builder.pos;
            (pRVar9->key).schema = schema;
            (pRVar9->key).scopeBindings = ptr;
            pRVar9->value = (RawBrandedSchema *)local_48;
            ppRVar3 = &(this->brands).table.rows.builder.pos;
            *ppRVar3 = *ppRVar3 + 1;
            *(RawSchema **)local_48 = schema;
            *(Scope **)((long)local_48 + 8) = ptr;
            *(uint32_t *)((long)local_48 + 0x18) = uVar16;
            *(BrandedInitializerImpl **)((long)local_48 + 0x20) = &this->brandedInitializer;
            uVar15._0_4_ = local_48.hash;
            uVar15._4_4_ = local_48.value;
            return (RawBrandedSchema *)uVar15;
          }
          if (((pHVar20->hash == uVar11) && (pEVar5[uVar4 - 2].key.schema == schema)) &&
             (pEVar5[uVar4 - 2].key.scopeBindings == ptr)) {
            kj::_::throwDuplicateTableRow();
          }
        }
        sVar19 = (ulong)uVar18 + 1;
        uVar18 = (uint)sVar19;
        if (sVar19 == sVar6) {
          uVar18 = 0;
        }
      } while( true );
    }
    HVar14 = local_78.ptr[2];
  }
  return (RawBrandedSchema *)HVar14;
}

Assistant:

const _::RawBrandedSchema* SchemaLoader::Impl::makeBranded(
    const _::RawSchema* schema, kj::ArrayPtr<const _::RawBrandedSchema::Scope> bindings) {
  if (bindings.size() == 0) {
    // `defaultBrand` is the version where all type parameters are bound to `AnyPointer`.
    return &schema->defaultBrand;
  }

  SchemaBindingsPair key { schema, bindings.begin() };
  KJ_IF_SOME(existing, brands.find(key)) {
    return existing;
  } else {
    auto& brand = arena.allocate<_::RawBrandedSchema>();
    memset(&brand, 0, sizeof(brand));
    brands.insert(key, &brand);

    brand.generic = schema;
    brand.scopes = bindings.begin();
    brand.scopeCount = bindings.size();
    brand.lazyInitializer = &brandedInitializer;
    return &brand;
  }